

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter.h
# Opt level: O0

void __thiscall BlockFilter::Serialize<DataStream>(BlockFilter *this,DataStream *s)

{
  long lVar1;
  DataStream *this_00;
  uint256 *in_RDI;
  long in_FS_OFFSET;
  GCSFilter *in_stack_ffffffffffffffc8;
  DataStream *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  DataStream::operator<<(in_stack_ffffffffffffffd8,(uchar *)in_RDI);
  this_00 = DataStream::operator<<(in_stack_ffffffffffffffd8,in_RDI);
  GCSFilter::GetEncoded(in_stack_ffffffffffffffc8);
  DataStream::operator<<(this_00,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& s) const {
        s << static_cast<uint8_t>(m_filter_type)
          << m_block_hash
          << m_filter.GetEncoded();
    }